

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::UniformTypes::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                \nstruct U {                     \n   bool a[3];                  \n   mediump vec4 b;                     \n   mediump mat3 c;                     \n   mediump float d[2];                 \n};                             \nstruct UU {                    \n   U a;                        \n   U b[2];                     \n   uvec2 c;                    \n};                             \nuniform mediump mat4 d;                \nuniform mediump mat3 e;                \nuniform mediump float h;               \nuniform int f;                 \nuniform U j;                   \nuniform UU k;                  \nuniform UU l[3];               \nout mediump vec4 color;                \nvoid main() {                  \n    mediump float tmp;                 \n    tmp = h + float(f) + e[2][2];           \n    tmp = tmp + d[0][0] + j.b.x;     \n    tmp = tmp + k.b[0].c[0][0];      \n    tmp = tmp + l[2].a.c[0][1];      \n    tmp = tmp + l[2].b[1].d[0];      \n    tmp = tmp + float(l[0].c.x);            \n    color = vec4(0, 1, 0, 1) * tmp;  \n}"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                \n"
			   "struct U {                     \n"
			   "   bool a[3];                  \n"
			   "   mediump vec4 b;                     \n"
			   "   mediump mat3 c;                     \n"
			   "   mediump float d[2];                 \n"
			   "};                             \n"
			   "struct UU {                    \n"
			   "   U a;                        \n"
			   "   U b[2];                     \n"
			   "   uvec2 c;                    \n"
			   "};                             \n"
			   "uniform mediump mat4 d;                \n"
			   "uniform mediump mat3 e;                \n"
			   "uniform mediump float h;               \n"
			   "uniform int f;                 \n"
			   "uniform U j;                   \n"
			   "uniform UU k;                  \n"
			   "uniform UU l[3];               \n"
			   "out mediump vec4 color;                \n"
			   "void main() {                  \n"
			   "    mediump float tmp;                 \n"
			   "    tmp = h + float(f) + e[2][2];           \n"
			   "    tmp = tmp + d[0][0] + j.b.x;     \n"
			   "    tmp = tmp + k.b[0].c[0][0];      \n"
			   "    tmp = tmp + l[2].a.c[0][1];      \n"
			   "    tmp = tmp + l[2].b[1].d[0];      \n"
			   "    tmp = tmp + float(l[0].c.x);            \n"
			   "    color = vec4(0, 1, 0, 1) * tmp;  \n"
			   "}";
	}